

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::insert(String *this,size_t pos1,char *s,size_t n)

{
  StringBaseType *__s;
  undefined1 local_48 [8];
  String tmp;
  size_t n_local;
  char *s_local;
  size_t pos1_local;
  String *this_local;
  
  tmp.mString.field_2._8_8_ = n;
  String((String *)local_48,s);
  __s = data((String *)local_48);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  insert(&this->mString,pos1,__s,tmp.mString.field_2._8_8_);
  ~String((String *)local_48);
  return this;
}

Assistant:

String& String::insert( size_t pos1, const char* s, size_t n ) {
	String tmp( s );

	mString.insert( pos1, tmp.data(), n );

	return *this;
}